

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall Piece::Piece(Piece *this)

{
  PieceSquareRawTableType *__s;
  pointer pPVar1;
  pointer pfVar2;
  PieceSquareTableInterpolating local_178;
  
  this->_vptr_Piece = (_func_int **)&PTR___cxa_pure_virtual_001202d0;
  __s = &(this->m_PieceSquareTable).super_PieceSquareTableBase.m_SourceTable;
  memset(__s,0,0x100);
  (this->m_PieceSquareTable).super_PieceSquareTableBase._vptr_PieceSquareTableBase =
       (_func_int **)&PTR_InvertColor_00120640;
  (this->m_PieceSquareTable).m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PieceSquareTable).m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PieceSquareTable).m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_PieceSquareTable).m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PieceSquareTable).m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PieceSquareTable).m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_PieceSquareTable).m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PieceSquareTable).m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PieceSquareTable).m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_PieceSquareTable).m_nCurrentTable = 0;
  (this->m_PieceSquareTable).m_fPhase = 0.0;
  this->m_Color = false;
  this->m_PieceType = NONE;
  this->m_pOtherColor = (Piece *)0x0;
  PieceSquareTableInterpolating::PieceSquareTableInterpolating(&local_178,&psrtDefault,0.0);
  memcpy(__s,&local_178.super_PieceSquareTableBase.m_SourceTable,0x100);
  pPVar1 = (this->m_PieceSquareTable).m_InterpolatedTables.
           super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->m_PieceSquareTable).m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_178.m_InterpolatedTables.
       super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_PieceSquareTable).m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_178.m_InterpolatedTables.
       super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_PieceSquareTable).m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_178.m_InterpolatedTables.
       super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_178.m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.m_InterpolatedTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  pPVar1 = (this->m_PieceSquareTable).m_SourceTables.
           super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->m_PieceSquareTable).m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_178.m_SourceTables.
       super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_PieceSquareTable).m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_178.m_SourceTables.
       super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_PieceSquareTable).m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_178.m_SourceTables.
       super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_178.m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.m_SourceTables.
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  pfVar2 = (this->m_PieceSquareTable).m_Phases.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->m_PieceSquareTable).m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_PieceSquareTable).m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_PieceSquareTable).m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2);
  }
  (this->m_PieceSquareTable).m_nCurrentTable = local_178.m_nCurrentTable;
  (this->m_PieceSquareTable).m_fPhase = local_178.m_fPhase;
  local_178.super_PieceSquareTableBase._vptr_PieceSquareTableBase =
       (_func_int **)&PTR_InvertColor_00120640;
  if (local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.m_Phases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_178.m_SourceTables.
      super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.m_SourceTables.
                    super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.m_InterpolatedTables.
      super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.m_InterpolatedTables.
                    super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Piece()
    {
        m_Color = BLACK;
        m_PieceType = NONE;
        m_pOtherColor = NULL;
        m_PieceSquareTable = psrtDefault;
    }